

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Command * Interpreter::RunInterpreter(InterpreterContext *context,const_iterator *itr)

{
  bool bVar1;
  Command *pCVar2;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  InterpreterContext *context_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  string command;
  
  bVar1 = std::operator!=(itr->_M_current,"");
  if (bVar1) {
    do {
      pbVar4 = itr->_M_current;
      if (*(pbVar4->_M_dataplus)._M_p != '#') {
        itr->_M_current = pbVar4 + 1;
        std::__cxx11::string::string((string *)&command,(string *)pbVar4);
        bVar1 = std::operator==(itr->_M_current,"");
        if (bVar1) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"unexpected end of file");
        }
        else {
          bVar1 = std::operator!=(itr->_M_current,"(");
          if (!bVar1) {
            pbVar4 = itr->_M_current + 1;
            itr->_M_current = pbVar4;
            parameters.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            parameters.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            parameters.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            while ((bVar1 = std::operator!=(pbVar4,""), bVar1 &&
                   (bVar1 = std::operator!=(itr->_M_current,")"), bVar1))) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&parameters,itr->_M_current);
              pbVar4 = itr->_M_current + 1;
              itr->_M_current = pbVar4;
            }
            context_00 = (InterpreterContext *)itr->_M_current;
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)context_00,"");
            if (bVar1) {
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar3,"unexpected end of file");
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            itr->_M_current = itr->_M_current + 1;
            pCVar2 = ConstructCommand(context_00,&command,&parameters);
            if (pCVar2 != (Command *)0x0) {
              (*pCVar2->_vptr_Command[2])(pCVar2,context,itr);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&parameters);
            std::__cxx11::string::~string((string *)&command);
            return pCVar2;
          }
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Invalid token, i am looking for \'(\'");
        }
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      itr->_M_current = pbVar4 + 1;
      bVar1 = std::operator==(pbVar4 + 1,"");
    } while (!bVar1);
  }
  return (Command *)0x0;
}

Assistant:

Command* Interpreter::RunInterpreter(InterpreterContext& context, std::vector<std::string>::const_iterator& itr)
{
    Command* result = nullptr;

    if (*itr != "")
    {
        while ((*itr)[0] == '#')
        {
            ++itr;
            if (*itr == "") return result;
        }

        // we assume everything is a command
        std::string command = *itr++;

        if (*itr == "")
        {
            throw std::runtime_error("unexpected end of file");
        }
        else if (*itr != "(")
        {
            throw std::runtime_error("Invalid token, i am looking for '('");
        }

        ++itr;  // skip (

        // grab all parameters until the next )
        std::vector<std::string> parameters;
        while (*itr != "" && *itr != ")")
        {
            parameters.push_back(*itr);
            ++itr;
        }
        if (*itr == "") throw std::runtime_error("unexpected end of file");

        ++itr;  // skip )

        auto i = Interpreter::ConstructCommand(context, command, parameters);
        if (i != nullptr)
        {
            i->Run(context, itr);
            result = i;
        }
    }

    return result;
}